

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(ImGuiID id)

{
  ImVec2 *mouse_pos;
  int *piVar1;
  int iVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiPopupData *pIVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  ImGuiPopupData *pIVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ImVec2 *pIVar15;
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  lVar12 = (long)(GImGui->CurrentWindow->IDStack).Size;
  if (0 < lVar12) {
    iVar11 = (GImGui->BeginPopupStack).Size;
    pIVar4 = GImGui->NavWindow;
    iVar2 = GImGui->FrameCount;
    uVar3 = (GImGui->CurrentWindow->IDStack).Data[lVar12 + -1];
    IVar7 = NavCalcPreferredRefPos();
    mouse_pos = &(pIVar8->IO).MousePos;
    local_38 = IVar7;
    bVar9 = IsMousePosValid(mouse_pos);
    pIVar15 = &local_38;
    if (bVar9) {
      pIVar15 = mouse_pos;
    }
    IVar5 = *pIVar15;
    iVar13 = (pIVar8->OpenPopupStack).Size;
    if (iVar11 < iVar13) {
      pIVar10 = (pIVar8->OpenPopupStack).Data;
      if ((pIVar10[iVar11].PopupId == id) &&
         (pIVar10[iVar11].OpenFrameCount == pIVar8->FrameCount + -1)) {
        pIVar10[iVar11].OpenFrameCount = iVar2;
      }
      else {
        iVar14 = iVar11 + 1;
        iVar13 = (pIVar8->OpenPopupStack).Capacity;
        if (iVar13 <= iVar11) {
          if (iVar13 == 0) {
            iVar13 = 8;
          }
          else {
            iVar13 = iVar13 / 2 + iVar13;
          }
          if (iVar13 <= iVar14) {
            iVar13 = iVar14;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pIVar10 = (ImGuiPopupData *)
                    (*GImAllocatorAllocFunc)((long)iVar13 * 0x30,GImAllocatorUserData);
          pIVar6 = (pIVar8->OpenPopupStack).Data;
          if (pIVar6 != (ImGuiPopupData *)0x0) {
            memcpy(pIVar10,pIVar6,(long)(pIVar8->OpenPopupStack).Size * 0x30);
            pIVar6 = (pIVar8->OpenPopupStack).Data;
            if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
          }
          (pIVar8->OpenPopupStack).Data = pIVar10;
          (pIVar8->OpenPopupStack).Capacity = iVar13;
        }
        (pIVar8->OpenPopupStack).Size = iVar14;
        pIVar10[iVar11].PopupId = id;
        pIVar10[iVar11].Window = (ImGuiWindow *)0x0;
        pIVar10[iVar11].SourceWindow = pIVar4;
        pIVar10[iVar11].OpenFrameCount = iVar2;
        pIVar10[iVar11].OpenParentId = uVar3;
        pIVar10[iVar11].OpenPopupPos = IVar7;
        pIVar10[iVar11].OpenMousePos = IVar5;
      }
    }
    else {
      if (iVar13 == (pIVar8->OpenPopupStack).Capacity) {
        if (iVar13 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar13 / 2 + iVar13;
        }
        iVar14 = iVar13 + 1;
        if (iVar13 + 1 < iVar11) {
          iVar14 = iVar11;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar10 = (ImGuiPopupData *)
                  (*GImAllocatorAllocFunc)((long)iVar14 * 0x30,GImAllocatorUserData);
        pIVar6 = (pIVar8->OpenPopupStack).Data;
        if (pIVar6 != (ImGuiPopupData *)0x0) {
          memcpy(pIVar10,pIVar6,(long)(pIVar8->OpenPopupStack).Size * 0x30);
          pIVar6 = (pIVar8->OpenPopupStack).Data;
          if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
        }
        (pIVar8->OpenPopupStack).Data = pIVar10;
        (pIVar8->OpenPopupStack).Capacity = iVar14;
        iVar13 = (pIVar8->OpenPopupStack).Size;
      }
      else {
        pIVar10 = (pIVar8->OpenPopupStack).Data;
      }
      pIVar10[iVar13].PopupId = id;
      pIVar10[iVar13].Window = (ImGuiWindow *)0x0;
      pIVar10[iVar13].SourceWindow = pIVar4;
      pIVar10[iVar13].OpenFrameCount = iVar2;
      pIVar10[iVar13].OpenParentId = uVar3;
      pIVar10[iVar13].OpenPopupPos = IVar7;
      pIVar10[iVar13].OpenMousePos = IVar5;
      (pIVar8->OpenPopupStack).Size = (pIVar8->OpenPopupStack).Size + 1;
    }
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x538,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}